

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddCustomTargetCommand.cxx
# Opt level: O2

bool cmAddCustomTargetCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmMakefile *this;
  pointer pbVar1;
  __single_object _Var2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  long lVar7;
  undefined7 extraout_var;
  size_type sVar8;
  string *psVar9;
  cmTarget *this_00;
  ulong uVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *psVar11;
  undefined8 uStack_250;
  __single_object cc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230 [2];
  ulong local_210;
  cmCustomCommandLine currentLine;
  string filename;
  cmCustomCommandLines commandLines;
  char *local_1a8;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_190;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  byproducts;
  cmAlphaNum local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string working_directory;
  string job_pool;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  string comment_buffer;
  string local_50;
  
  psVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (psVar11 ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cc,"called with incorrect number of arguments",
               (allocator<char> *)&local_168);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    psVar11 = (string *)&cc;
  }
  else {
    this = status->Makefile;
    lVar7 = std::__cxx11::string::find_first_of((char *)psVar11,0x5d35cc);
    if (lVar7 == -1) {
      currentLine.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
      super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      currentLine.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      currentLine.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
      super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
      super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      byproducts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      byproducts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      byproducts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      working_directory._M_dataplus._M_p = (pointer)&working_directory.field_2;
      working_directory._M_string_length = 0;
      comment_buffer._M_dataplus._M_p = (pointer)&comment_buffer.field_2;
      comment_buffer._M_string_length = 0;
      uStack_250 = 0;
      working_directory.field_2._M_local_buf[0] = '\0';
      comment_buffer.field_2._M_local_buf[0] = '\0';
      sources.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      sources.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      sources.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      job_pool._M_dataplus._M_p = (pointer)&job_pool.field_2;
      job_pool._M_string_length = 0;
      job_pool.field_2._M_local_buf[0] = '\0';
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      bVar4 = true;
      uVar10 = 1;
      if (0x20 < (ulong)((long)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1)) {
        bVar3 = std::operator==(pbVar1 + 1,"ALL");
        bVar4 = !bVar3;
        uVar10 = (ulong)(bVar3 + 1);
      }
      bVar6 = 0;
      local_210 = 0;
      bVar3 = false;
      local_1a8 = (char *)0x0;
LAB_0025c0b3:
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar10)
      goto LAB_0025c3f6;
      __lhs = pbVar1 + uVar10;
      bVar5 = std::operator==(__lhs,"DEPENDS");
      if (bVar5) {
LAB_0025c0e6:
        uStack_250 = 1;
      }
      else {
        bVar5 = std::operator==(__lhs,"BYPRODUCTS");
        if (bVar5) {
LAB_0025c100:
          uStack_250 = 2;
        }
        else {
          bVar5 = std::operator==(__lhs,"WORKING_DIRECTORY");
          if (bVar5) {
            uStack_250 = 3;
          }
          else {
            bVar5 = std::operator==(__lhs,"VERBATIM");
            if (bVar5) {
              bVar6 = 1;
            }
            else {
              bVar5 = std::operator==(__lhs,"USES_TERMINAL");
              if (bVar5) {
                local_210 = CONCAT71(extraout_var,1);
              }
              else {
                bVar5 = std::operator==(__lhs,"COMMAND_EXPAND_LISTS");
                if (!bVar5) {
                  bVar5 = std::operator==(__lhs,"COMMENT");
                  if (bVar5) {
LAB_0025c190:
                    uStack_250 = 4;
                  }
                  else {
                    bVar5 = std::operator==(__lhs,"JOB_POOL");
                    if (bVar5) {
                      uStack_250 = 6;
                    }
                    else {
                      bVar5 = std::operator==(__lhs,"COMMAND");
                      if (bVar5) {
                        uStack_250 = 0;
                        if (currentLine.
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start !=
                            currentLine.
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish) {
                          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
                          push_back(&commandLines.
                                     super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                    ,&currentLine);
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::clear(&currentLine.
                                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 );
                        }
                      }
                      else {
                        bVar5 = std::operator==(__lhs,"SOURCES");
                        if (bVar5) {
                          uStack_250 = 5;
                        }
                        else {
                          switch(uStack_250) {
                          case 0:
                            uStack_250 = 0;
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::push_back(&currentLine.
                                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ,__lhs);
                            break;
                          case 1:
                            std::__cxx11::string::string((string *)&cc,(string *)__lhs);
                            cmsys::SystemTools::ConvertToUnixSlashes((string *)&cc);
                            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                            emplace_back<std::__cxx11::string>
                                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                        *)&depends,(string *)&cc);
                            std::__cxx11::string::~string((string *)&cc);
                            goto LAB_0025c0e6;
                          case 2:
                            filename._M_dataplus._M_p = (pointer)&filename.field_2;
                            filename._M_string_length = 0;
                            filename.field_2._M_local_buf[0] = '\0';
                            bVar5 = cmsys::SystemTools::FileIsFullPath(__lhs);
                            if ((!bVar5) && (sVar8 = cmGeneratorExpression::Find(__lhs), sVar8 != 0)
                               ) {
                              psVar9 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
                              cc._M_t.
                              super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                              .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
                                   (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>
                                    )psVar9->_M_string_length;
                              local_168.View_._M_len = 1;
                              local_168.View_._M_str = local_168.Digits_;
                              local_168.Digits_[0] = '/';
                              cmStrCat<>(&local_50,(cmAlphaNum *)&cc,&local_168);
                              std::__cxx11::string::operator=
                                        ((string *)&filename,(string *)&local_50);
                              std::__cxx11::string::~string((string *)&local_50);
                            }
                            std::__cxx11::string::append((string *)&filename);
                            cmsys::SystemTools::ConvertToUnixSlashes(&filename);
                            bVar5 = cmsys::SystemTools::FileIsFullPath(&filename);
                            if (bVar5) {
                              cmsys::SystemTools::CollapseFullPath((string *)&cc,&filename);
                              std::__cxx11::string::operator=((string *)&filename,(string *)&cc);
                              std::__cxx11::string::~string((string *)&cc);
                            }
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::push_back(&byproducts,&filename);
                            std::__cxx11::string::~string((string *)&filename);
                            goto LAB_0025c100;
                          case 3:
                            std::__cxx11::string::_M_assign((string *)&working_directory);
                            uStack_250 = 3;
                            break;
                          case 4:
                            std::__cxx11::string::_M_assign((string *)&comment_buffer);
                            local_1a8 = comment_buffer._M_dataplus._M_p;
                            goto LAB_0025c190;
                          case 5:
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::push_back(&sources,__lhs);
                            uStack_250 = 5;
                            break;
                          case 6:
                            std::__cxx11::string::_M_assign((string *)&job_pool);
                            uStack_250 = 6;
                            break;
                          default:
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&cc,"Wrong syntax. Unknown type of argument.",
                                       (allocator<char> *)&local_168);
                            std::__cxx11::string::_M_assign((string *)&status->Error);
                            goto LAB_0025c608;
                          }
                        }
                      }
                    }
                  }
                  goto LAB_0025c176;
                }
                bVar3 = true;
              }
            }
            uStack_250 = 7;
          }
        }
      }
LAB_0025c176:
      uVar10 = (ulong)((int)uVar10 + 1);
      goto LAB_0025c0b3;
    }
    cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
    super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
         (__uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>)0x21;
    local_168.View_._M_str = (psVar11->_M_dataplus)._M_p;
    local_168.View_._M_len = psVar11->_M_string_length;
    cmStrCat<char[85]>(&working_directory,(cmAlphaNum *)&cc,&local_168,
                       (char (*) [85])
                       "\".  Target names may not contain a slash.  Use ADD_CUSTOM_COMMAND to generate files."
                      );
    std::__cxx11::string::_M_assign((string *)&status->Error);
    psVar11 = &working_directory;
  }
  std::__cxx11::string::~string((string *)psVar11);
  return false;
LAB_0025c3f6:
  lVar7 = std::__cxx11::string::find_first_of((char *)psVar11,0x5b86a6);
  if (lVar7 == -1) {
    bVar5 = cmGeneratorExpression::IsValidTargetName(psVar11);
    if ((((bVar5) && (bVar5 = cmGlobalGenerator::IsReservedTarget(psVar11), !bVar5)) &&
        (lVar7 = std::__cxx11::string::find((char)psVar11,0x3a), lVar7 == -1)) ||
       (bVar5 = cmMakefile::CheckCMP0037(this,psVar11,UTILITY), bVar5)) {
      if (currentLine.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          currentLine.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                  (&commandLines.
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                   &currentLine);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&currentLine.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
      }
      cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
      super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
      super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
           local_230;
      local_230[0]._M_local_buf[0] = '\0';
      bVar5 = cmMakefile::EnforceUniqueName(this,psVar11,(string *)&cc,true);
      if (bVar5) {
        std::__cxx11::string::~string((string *)&cc);
        if (commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
            super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
            super__Vector_impl_data._M_start ==
            commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
            super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          if (byproducts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              byproducts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            if ((local_210 & 1) == 0) {
              if (!bVar3) {
                local_210 = 0;
                goto LAB_0025c6c9;
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&cc,
                         "COMMAND_EXPAND_LISTS may not be specified without any COMMAND",
                         (allocator<char> *)&local_168);
              cmMakefile::IssueMessage(this,FATAL_ERROR,(string *)&cc);
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&cc,"USES_TERMINAL may not be specified without any COMMAND",
                         (allocator<char> *)&local_168);
              cmMakefile::IssueMessage(this,FATAL_ERROR,(string *)&cc);
            }
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&cc,"BYPRODUCTS may not be specified without any COMMAND",
                       (allocator<char> *)&local_168);
            cmMakefile::IssueMessage(this,FATAL_ERROR,(string *)&cc);
          }
          std::__cxx11::string::~string((string *)&cc);
        }
        else {
          if (((local_210 & 1) != 0) && (job_pool._M_string_length != 0)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&cc,"JOB_POOL is shadowed by USES_TERMINAL.",
                       (allocator<char> *)&local_168);
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_0025c608;
          }
LAB_0025c6c9:
          std::make_unique<cmCustomCommand>();
          cmCustomCommand::SetWorkingDirectory
                    ((cmCustomCommand *)
                     cc._M_t.
                     super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                     .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,
                     working_directory._M_dataplus._M_p);
          _Var2 = cc;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_88,&byproducts);
          cmCustomCommand::SetByproducts
                    ((cmCustomCommand *)
                     _Var2._M_t.
                     super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                     .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,&local_88);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_88);
          _Var2 = cc;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_a0,&depends);
          cmCustomCommand::SetDepends
                    ((cmCustomCommand *)
                     _Var2._M_t.
                     super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                     .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,&local_a0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_a0);
          _Var2 = cc;
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
                    (&local_b8,
                     &commandLines.
                      super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
          cmCustomCommand::SetCommandLines
                    ((cmCustomCommand *)
                     _Var2._M_t.
                     super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                     .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,
                     (cmCustomCommandLines *)&local_b8);
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_b8)
          ;
          cmCustomCommand::SetEscapeOldStyle
                    ((cmCustomCommand *)
                     cc._M_t.
                     super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                     .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,
                     (bool)(~bVar6 & 1));
          cmCustomCommand::SetComment
                    ((cmCustomCommand *)
                     cc._M_t.
                     super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                     .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,local_1a8);
          cmCustomCommand::SetUsesTerminal
                    ((cmCustomCommand *)
                     cc._M_t.
                     super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                     .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,
                     (bool)((byte)local_210 & 1));
          cmCustomCommand::SetCommandExpandLists
                    ((cmCustomCommand *)
                     cc._M_t.
                     super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                     .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,bVar3);
          cmCustomCommand::SetJobPool
                    ((cmCustomCommand *)
                     cc._M_t.
                     super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                     .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,&job_pool);
          local_190._M_t.
          super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
          super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
          super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
               cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
               super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl;
          cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t
          .super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
          super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
               (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
               (__uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>)0x0;
          this_00 = cmMakefile::AddUtilityCommand(this,psVar11,bVar4,&local_190);
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    (&local_190);
          cmTarget::AddSources(this_00,&sources);
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&cc);
        }
        bVar4 = true;
        goto LAB_0025c483;
      }
      std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_0025c608:
      psVar11 = (string *)&cc;
      goto LAB_0025c47c;
    }
  }
  else {
    cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
    super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
         (__uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>)0x26;
    local_168.Digits_[0] = (psVar11->_M_dataplus)._M_p[lVar7];
    local_168.View_._M_len = 1;
    local_168.View_._M_str = local_168.Digits_;
    cmStrCat<char[35]>(&filename,(cmAlphaNum *)&cc,&local_168,
                       (char (*) [35])"\".  This character is not allowed.");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    psVar11 = &filename;
LAB_0025c47c:
    std::__cxx11::string::~string((string *)psVar11);
  }
  bVar4 = false;
LAB_0025c483:
  std::__cxx11::string::~string((string *)&job_pool);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&sources);
  std::__cxx11::string::~string((string *)&comment_buffer);
  std::__cxx11::string::~string((string *)&working_directory);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&byproducts);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
            (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&currentLine.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  return bVar4;
}

Assistant:

bool cmAddCustomTargetCommand(std::vector<std::string> const& args,
                              cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();
  std::string const& targetName = args[0];

  // Check the target name.
  if (targetName.find_first_of("/\\") != std::string::npos) {
    status.SetError(cmStrCat("called with invalid target name \"", targetName,
                             "\".  Target names may not contain a slash.  "
                             "Use ADD_CUSTOM_COMMAND to generate files."));
    return false;
  }

  // Accumulate one command line at a time.
  cmCustomCommandLine currentLine;

  // Save all command lines.
  cmCustomCommandLines commandLines;

  // Accumulate dependencies.
  std::vector<std::string> depends;
  std::vector<std::string> byproducts;
  std::string working_directory;
  bool verbatim = false;
  bool uses_terminal = false;
  bool command_expand_lists = false;
  std::string comment_buffer;
  const char* comment = nullptr;
  std::vector<std::string> sources;
  std::string job_pool;

  // Keep track of parser state.
  enum tdoing
  {
    doing_command,
    doing_depends,
    doing_byproducts,
    doing_working_directory,
    doing_comment,
    doing_source,
    doing_job_pool,
    doing_nothing
  };
  tdoing doing = doing_command;

  // Look for the ALL option.
  bool excludeFromAll = true;
  unsigned int start = 1;
  if (args.size() > 1) {
    if (args[1] == "ALL") {
      excludeFromAll = false;
      start = 2;
    }
  }

  // Parse the rest of the arguments.
  for (unsigned int j = start; j < args.size(); ++j) {
    std::string const& copy = args[j];

    if (copy == "DEPENDS") {
      doing = doing_depends;
    } else if (copy == "BYPRODUCTS") {
      doing = doing_byproducts;
    } else if (copy == "WORKING_DIRECTORY") {
      doing = doing_working_directory;
    } else if (copy == "VERBATIM") {
      doing = doing_nothing;
      verbatim = true;
    } else if (copy == "USES_TERMINAL") {
      doing = doing_nothing;
      uses_terminal = true;
    } else if (copy == "COMMAND_EXPAND_LISTS") {
      doing = doing_nothing;
      command_expand_lists = true;
    } else if (copy == "COMMENT") {
      doing = doing_comment;
    } else if (copy == "JOB_POOL") {
      doing = doing_job_pool;
    } else if (copy == "COMMAND") {
      doing = doing_command;

      // Save the current command before starting the next command.
      if (!currentLine.empty()) {
        commandLines.push_back(currentLine);
        currentLine.clear();
      }
    } else if (copy == "SOURCES") {
      doing = doing_source;
    } else {
      switch (doing) {
        case doing_working_directory:
          working_directory = copy;
          break;
        case doing_command:
          currentLine.push_back(copy);
          break;
        case doing_byproducts: {
          std::string filename;
          if (!cmSystemTools::FileIsFullPath(copy) &&
              cmGeneratorExpression::Find(copy) != 0) {
            filename = cmStrCat(mf.GetCurrentBinaryDirectory(), '/');
          }
          filename += copy;
          cmSystemTools::ConvertToUnixSlashes(filename);
          if (cmSystemTools::FileIsFullPath(filename)) {
            filename = cmSystemTools::CollapseFullPath(filename);
          }
          byproducts.push_back(filename);
        } break;
        case doing_depends: {
          std::string dep = copy;
          cmSystemTools::ConvertToUnixSlashes(dep);
          depends.push_back(std::move(dep));
        } break;
        case doing_comment:
          comment_buffer = copy;
          comment = comment_buffer.c_str();
          break;
        case doing_source:
          sources.push_back(copy);
          break;
        case doing_job_pool:
          job_pool = copy;
          break;
        default:
          status.SetError("Wrong syntax. Unknown type of argument.");
          return false;
      }
    }
  }

  std::string::size_type pos = targetName.find_first_of("#<>");
  if (pos != std::string::npos) {
    status.SetError(cmStrCat("called with target name containing a \"",
                             targetName[pos],
                             "\".  This character is not allowed."));
    return false;
  }

  // Some requirements on custom target names already exist
  // and have been checked at this point.
  // The following restrictions overlap but depend on policy CMP0037.
  bool nameOk = cmGeneratorExpression::IsValidTargetName(targetName) &&
    !cmGlobalGenerator::IsReservedTarget(targetName);
  if (nameOk) {
    nameOk = targetName.find(':') == std::string::npos;
  }
  if (!nameOk && !mf.CheckCMP0037(targetName, cmStateEnums::UTILITY)) {
    return false;
  }

  // Store the last command line finished.
  if (!currentLine.empty()) {
    commandLines.push_back(currentLine);
    currentLine.clear();
  }

  // Enforce name uniqueness.
  {
    std::string msg;
    if (!mf.EnforceUniqueName(targetName, msg, true)) {
      status.SetError(msg);
      return false;
    }
  }

  if (commandLines.empty() && !byproducts.empty()) {
    mf.IssueMessage(MessageType::FATAL_ERROR,
                    "BYPRODUCTS may not be specified without any COMMAND");
    return true;
  }
  if (commandLines.empty() && uses_terminal) {
    mf.IssueMessage(MessageType::FATAL_ERROR,
                    "USES_TERMINAL may not be specified without any COMMAND");
    return true;
  }
  if (commandLines.empty() && command_expand_lists) {
    mf.IssueMessage(
      MessageType::FATAL_ERROR,
      "COMMAND_EXPAND_LISTS may not be specified without any COMMAND");
    return true;
  }

  if (uses_terminal && !job_pool.empty()) {
    status.SetError("JOB_POOL is shadowed by USES_TERMINAL.");
    return false;
  }

  // Add the utility target to the makefile.
  auto cc = cm::make_unique<cmCustomCommand>();
  cc->SetWorkingDirectory(working_directory.c_str());
  cc->SetByproducts(byproducts);
  cc->SetDepends(depends);
  cc->SetCommandLines(commandLines);
  cc->SetEscapeOldStyle(!verbatim);
  cc->SetComment(comment);
  cc->SetUsesTerminal(uses_terminal);
  cc->SetCommandExpandLists(command_expand_lists);
  cc->SetJobPool(job_pool);
  cmTarget* target =
    mf.AddUtilityCommand(targetName, excludeFromAll, std::move(cc));

  // Add additional user-specified source files to the target.
  target->AddSources(sources);

  return true;
}